

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

index_t __thiscall GEO::Delaunay3d::new_tetrahedron(Delaunay3d *this)

{
  iterator __position;
  pointer puVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  uint local_1c [3];
  
  uVar3 = this->first_free_;
  uVar4 = (ulong)uVar3;
  if (uVar4 == 0x7fffffff) {
    local_1c[2] = 0xffffffff;
    std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
              (&(this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
               ,(ulong)((int)((ulong)((long)(this->cell_to_v_store_).
                                            super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                            .
                                            super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->cell_to_v_store_).
                                           super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           .
                                           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) + 4),
               (value_type_conflict2 *)(local_1c + 2));
    local_1c[1] = 0xffffffff;
    std::vector<int,_GEO::Memory::aligned_allocator<int,_64>_>::resize
              (&(this->cell_to_cell_store_).
                super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>,
               (ulong)((int)((ulong)((long)(this->cell_to_cell_store_).
                                           super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           .
                                           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->cell_to_cell_store_).
                                          super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                          .
                                          super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) + 4),
               (value_type_conflict2 *)(local_1c + 1));
    local_1c[0] = 0xffffffff;
    __position._M_current =
         (this->cell_next_).
         super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->cell_next_).
        super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::
      _M_realloc_insert<unsigned_int>
                (&(this->cell_next_).
                  super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
                 __position,local_1c);
    }
    else {
      *__position._M_current = 0xffffffff;
      (this->cell_next_).
      super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
      super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar3 = ((uint)((ulong)((long)(this->cell_to_v_store_).
                                  super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                  super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->cell_to_v_store_).
                                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 4) & 0x3fffffff) - 1;
  }
  else {
    puVar1 = (this->cell_next_).
             super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->first_free_ = puVar1[uVar4];
    puVar1[uVar4] = 0xffffffff;
  }
  uVar4 = (ulong)(uVar3 * 4);
  piVar2 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
           super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2[uVar4] = -1;
  piVar2[uVar4 + 1] = -1;
  piVar2[uVar4 + 2] = -1;
  piVar2[uVar4 + 3] = -1;
  return uVar3;
}

Assistant:

index_t new_tetrahedron() {
            index_t result;
            if(first_free_ == END_OF_LIST) {
                cell_to_v_store_.resize(cell_to_v_store_.size() + 4, -1);
                cell_to_cell_store_.resize(cell_to_cell_store_.size() + 4, -1);
                // index_t(NOT_IN_LIST) is necessary, else with
                // NOT_IN_LIST alone the compiler tries to generate a
                // reference to NOT_IN_LIST resulting in a link error.
                cell_next_.push_back(index_t(NOT_IN_LIST));
                result = max_t() - 1;
            } else {
                result = first_free_;
                first_free_ = tet_next(first_free_);
                remove_tet_from_list(result);
            }

            cell_to_cell_store_[4 * result] = -1;
            cell_to_cell_store_[4 * result + 1] = -1;
            cell_to_cell_store_[4 * result + 2] = -1;
            cell_to_cell_store_[4 * result + 3] = -1;

            return result;
        }